

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

double __thiscall QPDFObjectHandle::getNumericValue(QPDFObjectHandle *this)

{
  bool bVar1;
  longlong lVar2;
  string local_40;
  double local_20;
  
  bVar1 = isInteger(this);
  if (bVar1) {
    lVar2 = getIntValue(this);
    local_20 = (double)lVar2;
  }
  else {
    bVar1 = isReal(this);
    if (bVar1) {
      getRealValue_abi_cxx11_(&local_40,this);
      local_20 = atof(local_40._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"returning 0","");
      typeWarning(this,"number",&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      local_20 = 0.0;
    }
  }
  return local_20;
}

Assistant:

double
QPDFObjectHandle::getNumericValue() const
{
    if (isInteger()) {
        return static_cast<double>(getIntValue());
    } else if (isReal()) {
        return atof(getRealValue().c_str());
    } else {
        typeWarning("number", "returning 0");
        QTC::TC("qpdf", "QPDFObjectHandle numeric non-numeric");
        return 0;
    }
}